

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

void cpool_close_and_destroy_all(cpool *cpool)

{
  undefined1 local_c0 [8];
  sigpipe_ignore pipe_st;
  connectdata *pcStack_18;
  int timeout_ms;
  connectdata *conn;
  cpool *cpool_local;
  
  pipe_st._156_4_ = 0;
  sigpipe_init((sigpipe_ignore *)local_c0);
  if (cpool != (cpool *)0x0) {
    if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
      Curl_share_lock(cpool->idata,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
    }
    cpool->field_0x98 = cpool->field_0x98 & 0xfe | 1;
  }
  pcStack_18 = cpool_get_live_conn(cpool);
  while (pcStack_18 != (connectdata *)0x0) {
    cpool_remove_conn(cpool,pcStack_18);
    sigpipe_apply(cpool->idata,(sigpipe_ignore *)local_c0);
    Curl_conncontrol(pcStack_18,1);
    cpool_discard_conn(cpool,cpool->idata,pcStack_18,false);
    pcStack_18 = cpool_get_live_conn(cpool);
  }
  if (((cpool != (cpool *)0x0) &&
      (cpool->field_0x98 = cpool->field_0x98 & 0xfe, cpool->share != (Curl_share *)0x0)) &&
     ((cpool->share->specifier & 0x20) != 0)) {
    Curl_share_unlock(cpool->idata,CURL_LOCK_DATA_CONNECT);
  }
  sigpipe_apply(cpool->idata,(sigpipe_ignore *)local_c0);
  cpool_shutdown_all(cpool,cpool->idata,pipe_st._156_4_);
  cpool_shutdown_discard_all(cpool);
  Curl_hostcache_clean(cpool->idata,(cpool->idata->dns).hostcache);
  sigpipe_restore((sigpipe_ignore *)local_c0);
  return;
}

Assistant:

static void cpool_close_and_destroy_all(struct cpool *cpool)
{
  struct connectdata *conn;
  int timeout_ms = 0;
  SIGPIPE_VARIABLE(pipe_st);

  DEBUGASSERT(cpool);
  /* Move all connections to the shutdown list */
  sigpipe_init(&pipe_st);
  CPOOL_LOCK(cpool);
  conn = cpool_get_live_conn(cpool);
  while(conn) {
    cpool_remove_conn(cpool, conn);
    sigpipe_apply(cpool->idata, &pipe_st);
    connclose(conn, "kill all");
    cpool_discard_conn(cpool, cpool->idata, conn, FALSE);

    conn = cpool_get_live_conn(cpool);
  }
  CPOOL_UNLOCK(cpool);

    /* Just for testing, run graceful shutdown */
#ifdef DEBUGBUILD
  {
    char *p = getenv("CURL_GRACEFUL_SHUTDOWN");
    if(p) {
      long l = strtol(p, NULL, 10);
      if(l > 0 && l < INT_MAX)
        timeout_ms = (int)l;
    }
  }
#endif
  sigpipe_apply(cpool->idata, &pipe_st);
  cpool_shutdown_all(cpool, cpool->idata, timeout_ms);

  /* discard all connections in the shutdown list */
  cpool_shutdown_discard_all(cpool);

  Curl_hostcache_clean(cpool->idata, cpool->idata->dns.hostcache);
  sigpipe_restore(&pipe_st);
}